

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

void __thiscall test_get_rows_back::initialize_tensors(test_get_rows_back *this,ggml_context *ctx)

{
  int iVar1;
  ggml_tensor *tensor;
  long lVar2;
  int i;
  long lVar3;
  vector<int,_std::allocator<int>_> data;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  tensor = (ggml_tensor *)ggml_get_first_tensor(ctx);
  for (; tensor != (ggml_tensor *)0x0; tensor = (ggml_tensor *)ggml_get_next_tensor(ctx,tensor)) {
    if (tensor->type == GGML_TYPE_I32) {
      if (3 < tensor->op - GGML_OP_RESHAPE) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_48,(long)this->b * (long)this->r,
                   &local_49);
        for (lVar3 = 0; lVar2 = (long)this->b * (long)this->r, lVar3 < lVar2; lVar3 = lVar3 + 1) {
          iVar1 = rand();
          local_48._M_impl.super__Vector_impl_data._M_start[lVar3] = iVar1 % this->m;
        }
        ggml_backend_tensor_set
                  (tensor,local_48._M_impl.super__Vector_impl_data._M_start,0,lVar2 * 4);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      }
    }
    else {
      init_tensor_uniform(tensor,-1.0,1.0);
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                if (ggml_is_view_op(t->op)) { continue; }
                // rows
                std::vector<int> data(r*b);
                for (int i = 0; i < r*b; i++) {
                    data[i] = rand() % m;
                }
                ggml_backend_tensor_set(t, data.data(), 0, r * b * sizeof(int));
            } else {
                init_tensor_uniform(t);
            }
        }
    }